

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O1

bool wallet::operator<(BytePrefix a,Span<const_std::byte> b)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  ulong __n;
  ulong uVar4;
  long __d2;
  ulong uVar5;
  ulong uVar6;
  long __d1;
  long in_FS_OFFSET;
  bool bVar7;
  
  uVar6 = a.prefix.m_size;
  uVar4 = b.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = uVar4;
  if (uVar6 <= uVar4) {
    uVar5 = uVar6;
  }
  __n = uVar6;
  if ((long)uVar5 < (long)uVar6) {
    __n = uVar5;
  }
  if (__n == 0) {
    bVar7 = true;
  }
  else {
    uVar3 = memcmp(a.prefix.m_data,b.m_data,__n);
    uVar4 = (ulong)(uVar3 >> 0x1f);
    bVar7 = uVar3 == 0;
  }
  bVar2 = (byte)uVar4;
  if (bVar7) {
    bVar2 = (long)uVar6 < (long)uVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(BytePrefix a, Span<const std::byte> b) { return std::ranges::lexicographical_compare(a.prefix, b.subspan(0, std::min(a.prefix.size(), b.size()))); }